

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_not_mtsafe_st_env_infrastructure.cpp
# Opt level: O1

disp_binder_unique_ptr_t __thiscall
so_5::env_infrastructures::simple_not_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>::
make_default_disp_binder
          (env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>
           *this)

{
  long in_RSI;
  outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t,_so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t,_so_5::env_infrastructures::simple_not_mtsafe::impl::disp_ds_name_parts_t>_>
  local_20;
  _func_int **local_18;
  
  local_20.m_ptr =
       (default_disp_impl_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t,_so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t,_so_5::env_infrastructures::simple_not_mtsafe::impl::disp_ds_name_parts_t>
        *)(in_RSI + 0x1b0);
  stdcpp::
  make_unique<so_5::env_infrastructures::st_reusable_stuff::default_disp_binder_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>>,so_5::outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t,so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t,so_5::env_infrastructures::simple_not_mtsafe::impl::disp_ds_name_parts_t>>>
            ((stdcpp *)&local_18,&local_20);
  (this->super_environment_infrastructure_t)._vptr_environment_infrastructure_t = local_18;
  return (__uniq_ptr_data<so_5::disp_binder_t,_std::default_delete<so_5::disp_binder_t>,_true,_true>
         )(__uniq_ptr_data<so_5::disp_binder_t,_std::default_delete<so_5::disp_binder_t>,_true,_true>
           )this;
}

Assistant:

disp_binder_unique_ptr_t
env_infrastructure_t< ACTIVITY_TRACKER >::make_default_disp_binder()
	{
		return stdcpp::make_unique< default_disp_binder_t >(
				outliving_mutable(m_default_disp) );
	}